

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

int arkInterpEvaluate_Lagrange
              (ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tau,int deriv,int degree,
              N_Vector yout)

{
  void *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  sunrealtype sVar8;
  sunrealtype local_90;
  undefined8 auStack_88 [6];
  N_Vector X [6];
  
  pvVar1 = I->content;
  uVar4 = 0;
  if (0 < degree) {
    uVar4 = (ulong)(uint)degree;
  }
  uVar5 = *(int *)((long)pvVar1 + 0x18) - 1;
  uVar6 = (ulong)uVar5;
  if ((int)uVar4 < (int)uVar5) {
    uVar6 = uVar4;
  }
  if ((uint)deriv < 4) {
    iVar3 = (int)uVar6;
    if (iVar3 < deriv) {
      N_VConst(0,yout);
    }
    else {
      puVar2 = *(undefined8 **)((long)pvVar1 + 8);
      if (iVar3 == 0) {
        N_VScale(0x3ff0000000000000,*puVar2,yout);
      }
      else {
        dVar7 = **(double **)((long)pvVar1 + 0x10);
        dVar7 = tau * (dVar7 - (*(double **)((long)pvVar1 + 0x10))[1]) + dVar7;
        if (iVar3 != 1) {
          for (uVar4 = 0; uVar4 <= uVar6; uVar4 = uVar4 + 1) {
            auStack_88[uVar4] = 0;
            X[uVar4] = (N_Vector)puVar2[uVar4];
          }
          iVar3 = (*(code *)(&DAT_0015dfdc + *(int *)(&DAT_0015dfdc + (ulong)(uint)deriv * 4)))();
          return iVar3;
        }
        if (deriv == 0) {
          local_90 = LBasis(I,0,dVar7);
          sVar8 = LBasis(I,1,dVar7);
        }
        else {
          local_90 = LBasisD(I,0,dVar7);
          sVar8 = LBasisD(I,1,dVar7);
        }
        N_VLinearSum(local_90,sVar8,*puVar2,puVar2[1],yout);
      }
    }
    iVar3 = 0;
  }
  else {
    iVar3 = -0x16;
    arkProcessError(ark_mem,-0x16,0x4bf,"arkInterpEvaluate_Lagrange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_interp.c"
                    ,"Requested illegal derivative.");
  }
  return iVar3;
}

Assistant:

int arkInterpEvaluate_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tau,
                               int deriv, int degree, N_Vector yout)
{
  /* local variables */
  int q, retval, i, j;
  sunrealtype tval;
  sunrealtype a[6];
  N_Vector X[6];
  int nhist;
  sunrealtype* thist;
  N_Vector* yhist;

  /* set readability shortcuts */
  nhist = LINT_NHIST(I);
  thist = LINT_THIST(I);
  yhist = LINT_YHIST(I);

  /* determine polynomial degree q */
  q = SUNMAX(degree, 0);    /* respect lower bound */
  q = SUNMIN(q, nhist - 1); /* respect max possible */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_DEBUG,
                     "ARKODE::arkInterpEvaluate_Lagrange", "interp-eval",
                     "tau = %" RSYM ", d = %i, q = %i", tau, deriv, q);
#endif

  /* error on illegal deriv */
  if ((deriv < 0) || (deriv > 3))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Requested illegal derivative.");
    return (ARK_ILL_INPUT);
  }

  /* if deriv is too high, just return zeros */
  if (deriv > q)
  {
    N_VConst(ZERO, yout);
    return (ARK_SUCCESS);
  }

  /* if constant interpolant is requested, just return ynew */
  if (q == 0)
  {
    N_VScale(ONE, yhist[0], yout);
    return (ARK_SUCCESS);
  }

  /* convert from tau back to t (both tnew and told are valid since q>0 => NHIST>1) */
  tval = thist[0] + tau * (thist[0] - thist[1]);

  /* linear interpolant */
  if (q == 1)
  {
    if (deriv == 0)
    {
      a[0] = LBasis(I, 0, tval);
      a[1] = LBasis(I, 1, tval);
    }
    else
    { /* deriv == 1 */
      a[0] = LBasisD(I, 0, tval);
      a[1] = LBasisD(I, 1, tval);
    }
    N_VLinearSum(a[0], yhist[0], a[1], yhist[1], yout);
    return (ARK_SUCCESS);
  }

  /* higher-degree interpolant */
  /*    initialize arguments for N_VLinearCombination */
  for (i = 0; i < q + 1; i++)
  {
    a[i] = ZERO;
    X[i] = yhist[i];
  }

  /*    construct linear combination coefficients based on derivative requested */
  switch (deriv)
  {
  case (0): /* p(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasis(I, j, tval); }
    break;

  case (1): /* p'(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD(I, j, tval); }
    break;

  case (2): /* p''(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD2(I, j, tval); }
    break;

  case (3): /* p'''(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD3(I, j, tval); }
    break;
  }

  /*    call N_VLinearCombination to evaluate the result, and return */
  retval = N_VLinearCombination(q + 1, a, X, yout);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  return (ARK_SUCCESS);
}